

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.cxx
# Opt level: O1

String * __thiscall cm::String::insert(String *this,size_type index,size_type count,char ch)

{
  type pSVar1;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::reserve((ulong)&local_48);
  std::__cxx11::string::_M_replace
            ((ulong)&local_48,0,(char *)local_48._M_string_length,(ulong)(this->view_)._M_str);
  std::__cxx11::string::insert((ulong)&local_48,index,(char)count);
  pSVar1 = operator=(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return pSVar1;
}

Assistant:

String& String::insert(size_type index, size_type count, char ch)
{
  std::string s;
  s.reserve(this->size() + count);
  s.assign(this->data(), this->size());
  s.insert(index, count, ch);
  return *this = std::move(s);
}